

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O2

double __thiscall
wasm::ReorderGlobals::computeSize(ReorderGlobals *this,IndexIndexMap *indices,IndexCountMap *counts)

{
  pointer puVar1;
  pointer pdVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  double total;
  double dVar7;
  double dVar8;
  
  puVar1 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  pdVar2 = (counts->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (this->always == false) {
    uVar3 = 0;
    dVar7 = 0.0;
    uVar6 = 0;
    for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      if (uVar4 == uVar6) {
        uVar6 = 1 << ((char)(uVar3 + 1) * '\a' & 0x1fU);
        uVar3 = uVar3 + 1;
      }
      dVar7 = dVar7 + (double)uVar3 * pdVar2[puVar1[uVar4]];
    }
  }
  else {
    dVar7 = 0.0;
    dVar8 = 0.0;
    for (uVar3 = 0; uVar3 < uVar5; uVar3 = uVar3 + 1) {
      dVar7 = dVar7 + (dVar8 * 0.0078125 + 1.0) * pdVar2[puVar1[uVar3]];
      dVar8 = dVar8 + 1.0;
    }
  }
  return dVar7;
}

Assistant:

double computeSize(IndexIndexMap& indices, IndexCountMap& counts) {
    if (always) {
      // In this mode we gradually increase the cost of later globals, in an
      // unrealistic but smooth manner.
      double total = 0;
      for (Index i = 0; i < indices.size(); i++) {
        // Multiply the count for this global by a smoothed LEB factor, which
        // starts at 1 (for 1 byte) at index 0, and then increases linearly with
        // i, so that after 128 globals we reach 2 (which is the true index at
        // which the LEB size normally jumps from 1 to 2), and so forth.
        total += counts[indices[i]] * (1.0 + (i / 128.0));
      }
      return total;
    }

    // The total size we are computing.
    double total = 0;
    // Track the size in bits and the next index at which the size increases. At
    // the first iteration we'll compute the size of the LEB for index 0, and so
    // forth.
    Index sizeInBits = 0;
    Index nextSizeIncrease = 0;
    for (Index i = 0; i < indices.size(); i++) {
      if (i == nextSizeIncrease) {
        sizeInBits++;
        // At the current size we have 7 * sizeInBits bits to use.  For example,
        // at index 0 the size is 1 and we'll compute 128 here, and indeed after
        // emitting 128 globals (0,..,127) the 129th (at index 128) requires a
        // larger LEB.
        nextSizeIncrease = 1 << (7 * sizeInBits);
      }
      total += counts[indices[i]] * sizeInBits;
    }
    return total;
  }